

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBFileStream.cpp
# Opt level: O0

void __thiscall
TPZBFileStream::WriteData<TFad<8,double>>(TPZBFileStream *this,TFad<8,_double> *p,int howMany)

{
  long in_RSI;
  long in_RDI;
  
  std::ostream::write((char *)(in_RDI + 0x210),in_RSI);
  return;
}

Assistant:

void TPZBFileStream::WriteData(const T *p, int howMany) {
    fOut.write(reinterpret_cast<const char *>(p), howMany * sizeof(T));
#ifdef PZDEBUG
    if (fOut.bad()) {
        PZError << "TBFileStream:Could not write to stream" << std::endl;
        DebugStop();
    }
#endif
}